

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celtexture.cpp
# Opt level: O0

FTexture * CELTexture_TryCreate(FileReader *file,int lumpnum)

{
  bool bVar1;
  undefined1 local_3c [8];
  CELHeader header;
  int lumpnum_local;
  FileReader *file_local;
  
  header.reserved._8_4_ = lumpnum;
  unique0x10000090 = file;
  (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
  bVar1 = anon_unknown.dwarf_6cd17b::LoadCELHeader(stack0xffffffffffffffe8,(CELHeader *)local_3c);
  if (bVar1) {
    file_local = (FileReader *)operator_new(0xa8);
    FCELTexture::FCELTexture((FCELTexture *)file_local,header.reserved._8_4_,(CELHeader *)local_3c);
  }
  else {
    file_local = (FileReader *)0x0;
  }
  return (FTexture *)file_local;
}

Assistant:

FTexture* CELTexture_TryCreate(FileReader& file, int lumpnum)
{
	file.Seek(0, SEEK_SET);

	CELHeader header;

	if (!LoadCELHeader(file, header))
	{
		return NULL;
	}

	return new FCELTexture(lumpnum, header);
}